

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCMakePathCommand.cxx
# Opt level: O2

bool anon_unknown.dwarf_11fb896::HandleCompareCommand
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *args,cmExecutionStatus *status)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__lhs;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__rhs;
  pointer pbVar1;
  bool bVar2;
  __type _Var3;
  char *pcVar4;
  cmMakefile *this;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__lhs_00;
  string_view value;
  allocator<char> local_51;
  string e;
  
  pbVar1 = (args->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  if ((ulong)((long)(args->
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar1) < 0x21) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&e,"sub-command COMPARE requires a mode to be specified.",&local_51);
    std::__cxx11::string::_M_assign((string *)&status->Error);
LAB_0038b91e:
    std::__cxx11::string::~string((string *)&e);
    return false;
  }
  __lhs_00 = pbVar1 + 1;
  bVar2 = std::operator==(__lhs_00,"EQUAL");
  if ((((!bVar2) && (bVar2 = std::operator==(__lhs_00,"NOTEQUAL"), !bVar2)) &&
      (bVar2 = std::operator==(__lhs_00,"LESS"), !bVar2)) &&
     (((bVar2 = std::operator==(__lhs_00,"LESS_EQUAL"), !bVar2 &&
       (bVar2 = std::operator==(__lhs_00,"GREATER"), !bVar2)) &&
      (bVar2 = std::operator==(__lhs_00,"GREATER_EQUAL"), !bVar2)))) {
    std::operator+(&e,"sub-command COMPARE does not recognize mode ",__lhs_00);
    std::__cxx11::string::_M_assign((string *)&status->Error);
    goto LAB_0038b91e;
  }
  pbVar1 = (args->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  if ((ulong)((long)(args->
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar1) < 0x81) {
    cmStrCat<char_const(&)[27],std::__cxx11::string_const&,char_const(&)[46]>
              (&e,(char (*) [27])"sub-command COMPARE, mode ",__lhs_00,(char (*) [46])0x74a152);
    std::__cxx11::string::_M_assign((string *)&status->Error);
    goto LAB_0038b91e;
  }
  __lhs = pbVar1 + 2;
  __rhs = pbVar1 + 3;
  bVar2 = std::operator==(__lhs_00,"LESS");
  if (bVar2) {
    bVar2 = std::operator<(__lhs,__rhs);
LAB_0038b9b9:
    if (bVar2 != false) {
LAB_0038b9bd:
      this = status->Makefile;
      pcVar4 = "1";
      goto LAB_0038b9f4;
    }
  }
  else {
    bVar2 = std::operator==(__lhs_00,"LESS_EQUAL");
    if (bVar2) {
      bVar2 = std::operator<=(__lhs,__rhs);
      goto LAB_0038b9b9;
    }
    bVar2 = std::operator==(__lhs_00,"GREATER");
    if (bVar2) {
      bVar2 = std::operator>(__lhs,__rhs);
      goto LAB_0038b9b9;
    }
    bVar2 = std::operator==(__lhs_00,"GREATER_EQUAL");
    if (bVar2) {
      bVar2 = std::operator>=(__lhs,__rhs);
      goto LAB_0038b9b9;
    }
    bVar2 = std::operator==(__lhs_00,"EQUAL");
    _Var3 = std::operator==(__lhs,__rhs);
    if (bVar2 == _Var3) goto LAB_0038b9bd;
  }
  this = status->Makefile;
  pcVar4 = "0";
LAB_0038b9f4:
  value._M_str = pcVar4;
  value._M_len = 1;
  cmMakefile::AddDefinition(this,pbVar1 + 4,value);
  return true;
}

Assistant:

bool HandleCompareCommand(std::vector<std::string> const& args,
                          cmExecutionStatus& status)
{
  if (args.size() != 5) {
    status.SetError("COMPARE must be called with four arguments.");
    return false;
  }

  static std::map<cm::string_view,
                  std::function<bool(const cmCMakePath&,
                                     const cmCMakePath&)>> const operators{
    { "EQUAL"_s,
      [](const cmCMakePath& path1, const cmCMakePath& path2) -> bool {
        return path1 == path2;
      } },
    { "NOT_EQUAL"_s,
      [](const cmCMakePath& path1, const cmCMakePath& path2) -> bool {
        return path1 != path2;
      } }
  };

  const auto op = operators.find(args[2]);
  if (op == operators.end()) {
    status.SetError(cmStrCat(
      "COMPARE called with an unknown comparison operator: ", args[2], "."));
    return false;
  }

  if (args[4].empty()) {
    status.SetError("Invalid name for output variable.");
    return false;
  }

  cmCMakePath path1(args[1]);
  cmCMakePath path2(args[3]);
  auto result = op->second(path1, path2);

  status.GetMakefile().AddDefinitionBool(args[4], result);

  return true;
}